

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_fixedpoint.c
# Opt level: O1

int FPFunction(N_Vector y,N_Vector f,void *mem)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  pdVar2 = *(double **)((long)y->content + 0x10);
  dVar5 = *pdVar2;
  dVar1 = pdVar2[1];
  dVar4 = pdVar2[2];
  dVar3 = cos(dVar1 * dVar4);
  **(double **)((long)f->content + 0x10) = dVar3 * 0.3333333333333333 + 0.16666666666666666;
  dVar4 = sin(dVar4);
  dVar4 = dVar5 * dVar5 + dVar4 + 1.06;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  *(double *)(*(long *)((long)f->content + 0x10) + 8) = dVar4 * 0.1111111111111111 + -0.1;
  dVar5 = exp(dVar1 * -dVar5);
  *(double *)(*(long *)((long)f->content + 0x10) + 0x10) = dVar5 * -0.05 + -0.47359877559830005;
  return 0;
}

Assistant:

int FPFunction(N_Vector y, N_Vector f, void *mem)
{
  realtype y1, y2, y3;

  y1 = NV_Ith_S(y,0);
  y2 = NV_Ith_S(y,1);
  y3 = NV_Ith_S(y,2);

  NV_Ith_S(f,0) = (ONE/THREE) * cos(y2*y3) + (ONE/SIX);
  NV_Ith_S(f,1) = (ONE/NINE) * sqrt(y1*y1 + sin(y3) + ONEPTZEROSIX) - PTONE;
  NV_Ith_S(f,2) = -(ONE/TWENTY) * exp(-y1*y2) - (TEN * PI - THREE) / SIXTY;

  return(0);
}